

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O1

void completeHessian(HighsInt full_dim,HighsHessian *hessian)

{
  iterator iVar1;
  iterator __position;
  HighsInt nnz;
  int local_40;
  HighsInt local_3c;
  double local_38;
  
  if (hessian->dim_ != full_dim) {
    local_3c = HighsHessian::numNz(hessian);
    HighsHessian::exactResize(hessian);
    local_40 = hessian->dim_;
    if (local_40 < full_dim) {
      do {
        iVar1._M_current =
             (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&hessian->index_,iVar1,&local_40);
        }
        else {
          *iVar1._M_current = local_40;
          (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_38 = 0.0;
        __position._M_current =
             (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&hessian->value_,__position,&local_38);
        }
        else {
          *__position._M_current = 0.0;
          (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        local_3c = local_3c + 1;
        iVar1._M_current =
             (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&hessian->start_,iVar1,&local_3c);
        }
        else {
          *iVar1._M_current = local_3c;
          (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_40 = local_40 + 1;
      } while (local_40 < full_dim);
    }
    hessian->dim_ = full_dim;
  }
  return;
}

Assistant:

void completeHessian(const HighsInt full_dim, HighsHessian& hessian) {
  // Ensure that any non-zero Hessian of dimension less than the
  // number of columns in the model is completed with explicit zero
  // diagonal entries
  assert(hessian.dim_ <= full_dim);
  if (hessian.dim_ == full_dim) return;
  HighsInt nnz = hessian.numNz();
  hessian.exactResize();
  for (HighsInt iCol = hessian.dim_; iCol < full_dim; iCol++) {
    hessian.index_.push_back(iCol);
    hessian.value_.push_back(0);
    nnz++;
    hessian.start_.push_back(nnz);
  }
  hessian.dim_ = full_dim;
  assert(HighsInt(hessian.start_.size()) == hessian.dim_ + 1);
}